

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_query_permission_granted_callback(ne_core_permission_event *event,void *user_data)

{
  byte bVar1;
  test_table *table;
  void *user_data_local;
  ne_core_permission_event *event_local;
  
  bVar1 = test_validate(event->permission == *(uint64_t *)((long)user_data + 8),0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                        ,0x200,"TEST_EXPECT(event->permission == table->permission) failed\n");
  *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar1;
  bVar1 = test_validate(event->current_state == ne_core_permission_state_granted,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                        ,0x201,
                        "TEST_EXPECT(event->current_state == ne_core_permission_state_granted) failed\n"
                       );
  *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar1;
  bVar1 = test_validate(event->previous_state == ne_core_permission_state_prompt,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                        ,0x202,
                        "TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt) failed\n"
                       );
  *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar1;
  if (*(long *)((long)user_data + 0x40) != 0) {
    **(undefined8 **)((long)user_data + 0x40) = 0;
  }
  *(undefined8 *)((long)user_data + 0x38) = 1;
  test_full((test_table *)user_data);
  return;
}

Assistant:

static void test_query_permission_granted_callback(
    const ne_core_permission_event *event, const void *user_data)
{
  auto table = static_cast<test_table *>(const_cast<void *>(user_data));
  TEST_EXPECT(event->permission == table->permission);
  TEST_EXPECT(event->current_state == ne_core_permission_state_granted);
  TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt);

  // We got permission so run both full and shared tests.
  TEST_CLEAR_RESULT();
  table->expected_result = NE_CORE_RESULT_SUCCESS;
  test_full(table);
}